

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  byte *pbVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  ostream *os_00;
  ostream *in_RSI;
  ulong in_RDI;
  size_t n_1;
  uchar nc;
  size_t n;
  uint32_t value;
  bool valid;
  size_t encBytes;
  uchar c;
  size_t idx;
  ulong in_stack_ffffffffffffff98;
  uchar uVar8;
  ulong local_48;
  ulong local_38;
  uint local_30;
  ulong local_18;
  
  local_18 = 0;
  while (uVar6 = local_18, uVar3 = std::__cxx11::string::size(), uVar6 < uVar3) {
    pbVar4 = (byte *)std::__cxx11::string::operator[](in_RDI);
    bVar1 = *pbVar4;
    os_00 = (ostream *)(ulong)(bVar1 - 0x22);
    switch(os_00) {
    case (ostream *)0x0:
      if (*(int *)(in_RDI + 0x20) == 1) {
        std::operator<<(in_RSI,"&quot;");
      }
      else {
        std::operator<<(in_RSI,bVar1);
      }
      break;
    default:
      uVar8 = (uchar)(in_stack_ffffffffffffff98 >> 0x38);
      if (((bVar1 < 9) || ((0xd < bVar1 && (bVar1 < 0x20)))) || (bVar1 == 0x7f)) {
        anon_unknown_34::hexEscapeChar(os_00,uVar8);
      }
      else if (bVar1 < 0x7f) {
        std::operator<<(in_RSI,bVar1);
      }
      else if ((bVar1 < 0xc0) || (0xf7 < bVar1)) {
        anon_unknown_34::hexEscapeChar(os_00,uVar8);
      }
      else {
        sVar5 = anon_unknown_34::trailingBytes((uchar)(uVar6 >> 0x38));
        in_stack_ffffffffffffff98 = (local_18 + sVar5) - 1;
        uVar6 = std::__cxx11::string::size();
        uVar8 = (uchar)(in_stack_ffffffffffffff98 >> 0x38);
        if (in_stack_ffffffffffffff98 < uVar6) {
          bVar2 = true;
          local_30 = anon_unknown_34::headerValue((uchar)(in_RDI >> 0x18));
          for (local_38 = 1; local_38 < sVar5; local_38 = local_38 + 1) {
            pbVar4 = (byte *)std::__cxx11::string::operator[](in_RDI);
            bVar2 = (bool)(bVar2 & (*pbVar4 & 0xc0) == 0x80);
            local_30 = local_30 << 6 | *pbVar4 & 0x3f;
          }
          if ((((bVar2) && (0x7f < local_30)) && ((0x7ff < local_30 || (sVar5 < 3)))) &&
             ((((local_30 < 0x801 || (0xffff < local_30)) || (sVar5 < 4)) && (local_30 < 0x110000)))
             ) {
            for (local_48 = 0; local_48 < sVar5; local_48 = local_48 + 1) {
              pcVar7 = (char *)std::__cxx11::string::operator[](in_RDI);
              std::operator<<(in_RSI,*pcVar7);
            }
            local_18 = (sVar5 - 1) + local_18;
          }
          else {
            anon_unknown_34::hexEscapeChar(os_00,uVar8);
          }
        }
        else {
          anon_unknown_34::hexEscapeChar(os_00,uVar8);
        }
      }
      break;
    case (ostream *)0x4:
      std::operator<<(in_RSI,"&amp;");
      break;
    case (ostream *)0x1a:
      std::operator<<(in_RSI,"&lt;");
      break;
    case (ostream *)0x1c:
      if (((local_18 < 3) ||
          (pcVar7 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar7 != ']')) ||
         (pcVar7 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar7 != ']')) {
        std::operator<<(in_RSI,bVar1);
      }
      else {
        std::operator<<(in_RSI,"&gt;");
      }
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void XmlEncode::encodeTo( std::ostream& os ) const {
        // Apostrophe escaping not necessary if we always use " to write attributes
        // (see: https://www.w3.org/TR/xml/#syntax)

        for( std::size_t idx = 0; idx < m_str.size(); ++ idx ) {
            uchar c = m_str[idx];
            switch (c) {
            case '<':   os << "&lt;"; break;
            case '&':   os << "&amp;"; break;

            case '>':
                // See: https://www.w3.org/TR/xml/#syntax
                if (idx > 2 && m_str[idx - 1] == ']' && m_str[idx - 2] == ']')
                    os << "&gt;";
                else
                    os << c;
                break;

            case '\"':
                if (m_forWhat == ForAttributes)
                    os << "&quot;";
                else
                    os << c;
                break;

            default:
                // Check for control characters and invalid utf-8

                // Escape control characters in standard ascii
                // see https://stackoverflow.com/questions/404107/why-are-control-characters-illegal-in-xml-1-0
                if (c < 0x09 || (c > 0x0D && c < 0x20) || c == 0x7F) {
                    hexEscapeChar(os, c);
                    break;
                }

                // Plain ASCII: Write it to stream
                if (c < 0x7F) {
                    os << c;
                    break;
                }

                // UTF-8 territory
                // Check if the encoding is valid and if it is not, hex escape bytes.
                // Important: We do not check the exact decoded values for validity, only the encoding format
                // First check that this bytes is a valid lead byte:
                // This means that it is not encoded as 1111 1XXX
                // Or as 10XX XXXX
                if (c <  0xC0 ||
                    c >= 0xF8) {
                    hexEscapeChar(os, c);
                    break;
                }

                auto encBytes = trailingBytes(c);
                // Are there enough bytes left to avoid accessing out-of-bounds memory?
                if (idx + encBytes - 1 >= m_str.size()) {
                    hexEscapeChar(os, c);
                    break;
                }
                // The header is valid, check data
                // The next encBytes bytes must together be a valid utf-8
                // This means: bitpattern 10XX XXXX and the extracted value is sane (ish)
                bool valid = true;
                uint32_t value = headerValue(c);
                for (std::size_t n = 1; n < encBytes; ++n) {
                    uchar nc = m_str[idx + n];
                    valid &= ((nc & 0xC0) == 0x80);
                    value = (value << 6) | (nc & 0x3F);
                }

                if (
                    // Wrong bit pattern of following bytes
                    (!valid) ||
                    // Overlong encodings
                    (value < 0x80) ||
                    (                 value < 0x800   && encBytes > 2) || // removed "0x80 <= value &&" because redundant
                    (0x800 < value && value < 0x10000 && encBytes > 3) ||
                    // Encoded value out of range
                    (value >= 0x110000)
                    ) {
                    hexEscapeChar(os, c);
                    break;
                }

                // If we got here, this is in fact a valid(ish) utf-8 sequence
                for (std::size_t n = 0; n < encBytes; ++n) {
                    os << m_str[idx + n];
                }
                idx += encBytes - 1;
                break;
            }
        }
    }